

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

void fe_spec2cep(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep)

{
  byte bVar1;
  uint uVar2;
  melfb_t *pmVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  
  fVar8 = (float)((double)*mflogspec * 0.5);
  pmVar3 = fe->mel_fb;
  uVar2 = pmVar3->num_filters;
  for (lVar5 = 1; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    fVar8 = (float)((double)fVar8 + (double)mflogspec[lVar5]);
    *mfcep = (mfcc_t)fVar8;
  }
  dVar9 = (double)(int)uVar2;
  *mfcep = (mfcc_t)(float)((double)fVar8 / dVar9);
  bVar1 = fe->num_cepstra;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  for (uVar6 = 1; uVar6 < bVar1; uVar6 = uVar6 + 1) {
    mfcep[uVar6] = 0.0;
    fVar8 = 0.0;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      fVar8 = (float)((double)(float)pmVar3->mel_cosine[uVar6][uVar7] * (double)mflogspec[uVar7] *
                      *(double *)(&DAT_001551a0 + (ulong)(uVar7 == 0) * 8) + (double)fVar8);
      mfcep[uVar6] = (mfcc_t)fVar8;
    }
    mfcep[uVar6] = (mfcc_t)(float)((double)fVar8 / (dVar9 + dVar9));
  }
  return;
}

Assistant:

void
fe_spec2cep(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep)
{
    int32 i, j, beta;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0] / 2;        /* beta = 0.5 */
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];       /* beta = 1.0 */
    mfcep[0] /= (frame_t) fe->mel_fb->num_filters;

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            if (j == 0)
                beta = 1;       /* 0.5 */
            else
                beta = 2;       /* 1.0 */
            mfcep[i] += COSMUL(mflogspec[j],
                               fe->mel_fb->mel_cosine[i][j]) * beta;
        }
        /* Note that this actually normalizes by num_filters, like the
         * original Sphinx front-end, due to the doubled 'beta' factor
         * above.  */
        mfcep[i] /= (frame_t) fe->mel_fb->num_filters * 2;
    }
}